

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::addRenderTest
          (anon_unknown_0 *this,TestCaseGroup *group,string *namePrefix,string *descPrefix,
          int numIterations,ParamFlags flags,TestParams params)

{
  Context *ctx;
  undefined1 uVar1;
  SeparateShaderTest *this_00;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  string *local_358;
  string local_348;
  undefined1 local_328 [16];
  ostringstream name;
  ios_base local_2a8 [264];
  ostringstream desc;
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&name,(char *)(group->super_TestCaseGroup).super_TestNode._vptr_TestNode,
             (long)(group->super_TestCaseGroup).super_TestNode.m_testCtx);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&desc,(namePrefix->_M_dataplus)._M_p,namePrefix->_M_string_length);
  params.switchVtx = (bool)((byte)(((ulong)descPrefix & 0xffffffff) >> 1) & 1);
  params.switchFrg = (bool)((byte)descPrefix & 1);
  bVar4 = ((ulong)descPrefix & 4) == 0;
  params.initSingle = SUB41(((uint)descPrefix & 4) >> 2,0);
  pcVar3 = "single_program";
  if (bVar4) {
    pcVar3 = "separate_programs";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar3,(ulong)bVar4 * 3 + 0xe)
  ;
  bVar4 = ((ulong)descPrefix & 4) == 0;
  pcVar3 = "Single program with two shaders";
  if (bVar4) {
    pcVar3 = "Separate programs for each shader";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&desc,pcVar3,(ulong)bVar4 * 2 + 0x1f);
  switch((uint)descPrefix & 3) {
  case 0:
    goto switchD_00426ab8_caseD_0;
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_add_fragment",0xd);
    lVar2 = 0x1d;
    pcVar3 = ", then add a fragment program";
    break;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_add_vertex",0xb);
    lVar2 = 0x1b;
    pcVar3 = ", then add a vertex program";
    break;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_add_both",9);
    lVar2 = 0x2a;
    pcVar3 = ", then add both vertex and shader programs";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,pcVar3,lVar2);
switchD_00426ab8_caseD_0:
  bVar4 = paramsValid(&params);
  if (bVar4) {
    this_00 = (SeparateShaderTest *)operator_new(0x180);
    ctx = *(Context **)(this + 0x70);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    SeparateShaderTest::SeparateShaderTest
              (this_00,ctx,local_358,(string *)local_348.field_2._M_allocated_capacity,4,&params,
               0x426ed6);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    if ((string *)local_348.field_2._M_allocated_capacity != (string *)local_328) {
      operator_delete((void *)local_348.field_2._M_allocated_capacity,(ulong)(local_328._0_8_ + 1));
    }
    if (local_358 != &local_348) {
      operator_delete(local_358,(ulong)(local_348._M_dataplus._M_p + 1));
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
  std::ios_base::~ios_base(local_130);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  uVar1 = std::ios_base::~ios_base(local_2a8);
  return (bool)uVar1;
}

Assistant:

bool addRenderTest (TestCaseGroup& group, const string& namePrefix, const string& descPrefix,
					int numIterations, ParamFlags flags, TestParams params)
{
	ostringstream	name;
	ostringstream	desc;

	DE_ASSERT(areCaseParamFlagsValid(flags));

	name << namePrefix;
	desc << descPrefix;

	params.initSingle	= (flags & PARAMFLAGS_INIT_SINGLE) != 0;
	params.switchVtx	= (flags & PARAMFLAGS_SWITCH_VERTEX) != 0;
	params.switchFrg	= (flags & PARAMFLAGS_SWITCH_FRAGMENT) != 0;

	name << (flags & PARAMFLAGS_INIT_SINGLE ? "single_program" : "separate_programs");
	desc << (flags & PARAMFLAGS_INIT_SINGLE
			 ? "Single program with two shaders"
			 : "Separate programs for each shader");

	switch (flags & (PARAMFLAGS_SWITCH_FRAGMENT | PARAMFLAGS_SWITCH_VERTEX))
	{
		case 0:
			break;
		case PARAMFLAGS_SWITCH_FRAGMENT:
			name << "_add_fragment";
			desc << ", then add a fragment program";
			break;
		case PARAMFLAGS_SWITCH_VERTEX:
			name << "_add_vertex";
			desc << ", then add a vertex program";
			break;
		case PARAMFLAGS_SWITCH_FRAGMENT | PARAMFLAGS_SWITCH_VERTEX:
			name << "_add_both";
			desc << ", then add both vertex and shader programs";
			break;
	}

	if (!paramsValid(params))
		return false;

	group.addChild(new SeparateShaderTest(group.getContext(), name.str(), desc.str(),
										  numIterations, params,
										  &SeparateShaderTest::testPipelineRendering));

	return true;
}